

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O1

EStatusCode __thiscall
ShadingWriter::WriteShadingPatternObjectWithPDFNativeFunctions
          (ShadingWriter *this,RadialShading *inRadialShading,PDFRectangle *inBounds,
          PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  EStatusCode EVar1;
  double coords [6];
  
  coords[0] = inRadialShading->x0;
  coords[1] = inRadialShading->y0;
  coords[2] = inRadialShading->r0;
  coords[3] = inRadialShading->x1;
  coords[4] = inRadialShading->y1;
  coords[5] = inRadialShading->r1;
  EVar1 = WriteShadingPatternObjectWithPDFNativeFunctions
                    (this,3,coords,6,&inRadialShading->colorLine,(PDFRectangle *)inMatrix,inMatrix,
                     inPatternObjectId);
  return EVar1;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteShadingPatternObjectWithPDFNativeFunctions(
    const RadialShading& inRadialShading, 
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId
) {
    double coords[] = {inRadialShading.x0, inRadialShading.y0, inRadialShading.r0,
                       inRadialShading.x1, inRadialShading.y1, inRadialShading.r1};

    return WriteShadingPatternObjectWithPDFNativeFunctions(
        3,
        coords,
        6,
        inRadialShading.colorLine,
        inBounds,
        inMatrix,
        inPatternObjectId
    );
}